

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSequentialImpulseConstraintSolver.cpp
# Opt level: O1

btScalar gResolveSingleConstraintRowGeneric_scalar_reference
                   (btSolverBody *body1,btSolverBody *body2,btSolverConstraint *c)

{
  float fVar1;
  float fVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar1 = c->m_appliedImpulse;
  uVar3 = *(undefined8 *)(c->m_contactNormal1).m_floats;
  fVar2 = (c->m_contactNormal1).m_floats[2];
  fVar11 = (float)uVar3;
  fVar12 = (float)((ulong)uVar3 >> 0x20);
  fVar10 = ((c->m_rhs - c->m_cfm * fVar1) -
           ((body1->m_deltaAngularVelocity).m_floats[2] * (c->m_relpos1CrossNormal).m_floats[2] +
            (body1->m_deltaAngularVelocity).m_floats[0] * (c->m_relpos1CrossNormal).m_floats[0] +
            (body1->m_deltaAngularVelocity).m_floats[1] * (c->m_relpos1CrossNormal).m_floats[1] +
           (body1->m_deltaLinearVelocity).m_floats[2] * fVar2 +
           (body1->m_deltaLinearVelocity).m_floats[0] * fVar11 +
           (body1->m_deltaLinearVelocity).m_floats[1] * fVar12) * c->m_jacDiagABInv) -
           ((body2->m_deltaAngularVelocity).m_floats[2] * (c->m_relpos2CrossNormal).m_floats[2] +
            (body2->m_deltaAngularVelocity).m_floats[0] * (c->m_relpos2CrossNormal).m_floats[0] +
            (body2->m_deltaAngularVelocity).m_floats[1] * (c->m_relpos2CrossNormal).m_floats[1] +
           (body2->m_deltaLinearVelocity).m_floats[2] * (c->m_contactNormal2).m_floats[2] +
           (body2->m_deltaLinearVelocity).m_floats[0] * (c->m_contactNormal2).m_floats[0] +
           (body2->m_deltaLinearVelocity).m_floats[1] * (c->m_contactNormal2).m_floats[1]) *
           c->m_jacDiagABInv;
  fVar13 = fVar1 + fVar10;
  fVar9 = c->m_lowerLimit;
  if ((fVar13 < c->m_lowerLimit) || (fVar9 = c->m_upperLimit, c->m_upperLimit < fVar13)) {
    fVar13 = fVar9;
    fVar10 = fVar13 - fVar1;
  }
  c->m_appliedImpulse = fVar13;
  if (body1->m_originalBody != (btRigidBody *)0x0) {
    fVar1 = (body1->m_invMass).m_floats[2];
    fVar13 = (body1->m_linearFactor).m_floats[2];
    uVar3 = *(undefined8 *)(body1->m_invMass).m_floats;
    uVar4 = *(undefined8 *)(body1->m_deltaLinearVelocity).m_floats;
    uVar5 = *(undefined8 *)(body1->m_deltaAngularVelocity).m_floats;
    uVar6 = *(undefined8 *)(body1->m_angularFactor).m_floats;
    uVar7 = *(undefined8 *)(body1->m_linearFactor).m_floats;
    *(ulong *)(body1->m_deltaLinearVelocity).m_floats =
         CONCAT44((float)((ulong)uVar7 >> 0x20) * fVar12 * (float)((ulong)uVar3 >> 0x20) * fVar10 +
                  (float)((ulong)uVar4 >> 0x20),
                  (float)uVar7 * fVar11 * (float)uVar3 * fVar10 + (float)uVar4);
    (body1->m_deltaLinearVelocity).m_floats[2] =
         fVar2 * fVar1 * fVar10 * fVar13 + (body1->m_deltaLinearVelocity).m_floats[2];
    fVar1 = (body1->m_angularFactor).m_floats[2];
    fVar2 = (c->m_angularComponentA).m_floats[2];
    uVar3 = *(undefined8 *)(c->m_angularComponentA).m_floats;
    *(ulong *)(body1->m_deltaAngularVelocity).m_floats =
         CONCAT44((float)((ulong)uVar3 >> 0x20) * (float)((ulong)uVar6 >> 0x20) * fVar10 +
                  (float)((ulong)uVar5 >> 0x20),(float)uVar3 * (float)uVar6 * fVar10 + (float)uVar5)
    ;
    (body1->m_deltaAngularVelocity).m_floats[2] =
         fVar1 * fVar10 * fVar2 + (body1->m_deltaAngularVelocity).m_floats[2];
  }
  if (body2->m_originalBody != (btRigidBody *)0x0) {
    fVar1 = (c->m_contactNormal2).m_floats[2];
    fVar2 = (body2->m_invMass).m_floats[2];
    fVar13 = (body2->m_linearFactor).m_floats[2];
    uVar3 = *(undefined8 *)(c->m_contactNormal2).m_floats;
    uVar4 = *(undefined8 *)(body2->m_invMass).m_floats;
    uVar5 = *(undefined8 *)(body2->m_deltaLinearVelocity).m_floats;
    uVar6 = *(undefined8 *)(body2->m_deltaAngularVelocity).m_floats;
    uVar7 = *(undefined8 *)(body2->m_angularFactor).m_floats;
    uVar8 = *(undefined8 *)(body2->m_linearFactor).m_floats;
    *(ulong *)(body2->m_deltaLinearVelocity).m_floats =
         CONCAT44((float)((ulong)uVar8 >> 0x20) *
                  (float)((ulong)uVar4 >> 0x20) * (float)((ulong)uVar3 >> 0x20) * fVar10 +
                  (float)((ulong)uVar5 >> 0x20),
                  (float)uVar8 * (float)uVar4 * (float)uVar3 * fVar10 + (float)uVar5);
    (body2->m_deltaLinearVelocity).m_floats[2] =
         fVar1 * fVar2 * fVar10 * fVar13 + (body2->m_deltaLinearVelocity).m_floats[2];
    fVar1 = (body2->m_angularFactor).m_floats[2];
    fVar2 = (c->m_angularComponentB).m_floats[2];
    uVar3 = *(undefined8 *)(c->m_angularComponentB).m_floats;
    *(ulong *)(body2->m_deltaAngularVelocity).m_floats =
         CONCAT44((float)((ulong)uVar3 >> 0x20) * (float)((ulong)uVar7 >> 0x20) * fVar10 +
                  (float)((ulong)uVar6 >> 0x20),(float)uVar3 * (float)uVar7 * fVar10 + (float)uVar6)
    ;
    (body2->m_deltaAngularVelocity).m_floats[2] =
         fVar1 * fVar10 * fVar2 + (body2->m_deltaAngularVelocity).m_floats[2];
  }
  return fVar10;
}

Assistant:

static btSimdScalar gResolveSingleConstraintRowGeneric_scalar_reference(btSolverBody& body1, btSolverBody& body2, const btSolverConstraint& c)
{
	btScalar deltaImpulse = c.m_rhs - btScalar(c.m_appliedImpulse)*c.m_cfm;
	const btScalar deltaVel1Dotn = c.m_contactNormal1.dot(body1.internalGetDeltaLinearVelocity()) + c.m_relpos1CrossNormal.dot(body1.internalGetDeltaAngularVelocity());
	const btScalar deltaVel2Dotn = c.m_contactNormal2.dot(body2.internalGetDeltaLinearVelocity()) + c.m_relpos2CrossNormal.dot(body2.internalGetDeltaAngularVelocity());

	//	const btScalar delta_rel_vel	=	deltaVel1Dotn-deltaVel2Dotn;
	deltaImpulse -= deltaVel1Dotn*c.m_jacDiagABInv;
	deltaImpulse -= deltaVel2Dotn*c.m_jacDiagABInv;

	const btScalar sum = btScalar(c.m_appliedImpulse) + deltaImpulse;
	if (sum < c.m_lowerLimit)
	{
		deltaImpulse = c.m_lowerLimit - c.m_appliedImpulse;
		c.m_appliedImpulse = c.m_lowerLimit;
	}
	else if (sum > c.m_upperLimit)
	{
		deltaImpulse = c.m_upperLimit - c.m_appliedImpulse;
		c.m_appliedImpulse = c.m_upperLimit;
	}
	else
	{
		c.m_appliedImpulse = sum;
	}

	body1.internalApplyImpulse(c.m_contactNormal1*body1.internalGetInvMass(), c.m_angularComponentA, deltaImpulse);
	body2.internalApplyImpulse(c.m_contactNormal2*body2.internalGetInvMass(), c.m_angularComponentB, deltaImpulse);

	return deltaImpulse;
}